

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkCrossCut_rec(Abc_Obj_t *pObj,int *pnCutSize,int *pnCutSizeMax)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  undefined4 local_38;
  int fReverse;
  int nDecrem;
  int i;
  Abc_Obj_t *pFanin;
  int *pnCutSizeMax_local;
  int *pnCutSize_local;
  Abc_Obj_t *pObj_local;
  
  local_38 = 0;
  iVar1 = Abc_ObjIsCi(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_NodeIsTravIdCurrent(pObj);
    if (iVar1 == 0) {
      Abc_NodeSetTravIdCurrent(pObj);
      iVar1 = Abc_ObjIsCi(pObj);
      if (iVar1 == 0) {
        for (fReverse = 0; iVar1 = Abc_ObjFaninNum(pObj), fReverse < iVar1; fReverse = fReverse + 1)
        {
          pObj_00 = Abc_ObjFanin(pObj,fReverse);
          iVar1 = Abc_NtkCrossCut_rec(pObj_00,pnCutSize,pnCutSizeMax);
          local_38 = iVar1 + local_38;
        }
      }
      *pnCutSize = *pnCutSize + 1;
      if (*pnCutSizeMax < *pnCutSize) {
        *pnCutSizeMax = *pnCutSize;
      }
      *pnCutSize = *pnCutSize - local_38;
      pObj_local._4_4_ = Abc_ObjCrossCutInc(pObj);
    }
    else {
      pObj_local._4_4_ = Abc_ObjCrossCutInc(pObj);
    }
  }
  else {
    pObj_local._4_4_ = 0;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_NtkCrossCut_rec( Abc_Obj_t * pObj, int * pnCutSize, int * pnCutSizeMax )
{
    Abc_Obj_t * pFanin;
    int i, nDecrem = 0;
    int fReverse = 0;
    if ( Abc_ObjIsCi(pObj) )
        return 0;
    // if visited, increment visit counter 
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return Abc_ObjCrossCutInc( pObj );
    Abc_NodeSetTravIdCurrent( pObj );
    // visit the fanins
    if ( !Abc_ObjIsCi(pObj) )
    {
        if ( fReverse )
        {
            Abc_ObjForEachFanin( pObj, pFanin, i )
            {
                pFanin = Abc_ObjFanin( pObj, Abc_ObjFaninNum(pObj) - 1 - i );
                nDecrem += Abc_NtkCrossCut_rec( pFanin, pnCutSize, pnCutSizeMax );
            }
        }
        else
        {
            Abc_ObjForEachFanin( pObj, pFanin, i )
                nDecrem += Abc_NtkCrossCut_rec( pFanin, pnCutSize, pnCutSizeMax );
        }
    }
    // count the node
    (*pnCutSize)++;
    if ( *pnCutSizeMax < *pnCutSize )
        *pnCutSizeMax = *pnCutSize;
    (*pnCutSize) -= nDecrem;
    return Abc_ObjCrossCutInc( pObj );
}